

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testloadso.c
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *pFVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  code *pcVar5;
  undefined8 uVar6;
  char *pcVar7;
  char *pcVar8;
  
  if (argc == 3) {
    iVar2 = SDL_Init(0);
    pFVar1 = _stderr;
    if (iVar2 < 0) {
      uVar6 = SDL_GetError();
      fprintf(pFVar1,"Couldn\'t initialize SDL: %s\n",uVar6);
      iVar2 = 2;
    }
    else {
      pcVar7 = argv[1];
      iVar3 = strcmp(pcVar7,"--hello");
      if (iVar3 == 0) {
        pcVar7 = argv[2];
      }
      pcVar8 = "puts";
      if (iVar3 != 0) {
        pcVar8 = argv[2];
      }
      lVar4 = SDL_LoadObject(pcVar7);
      pFVar1 = _stderr;
      if (lVar4 == 0) {
        uVar6 = SDL_GetError();
        fprintf(pFVar1,"SDL_LoadObject(\'%s\') failed: %s\n",pcVar7,uVar6);
        iVar2 = 3;
      }
      else {
        pcVar5 = (code *)SDL_LoadFunction(lVar4,pcVar8);
        pFVar1 = _stderr;
        if (pcVar5 == (code *)0x0) {
          uVar6 = SDL_GetError();
          fprintf(pFVar1,"SDL_LoadFunction(\'%s\') failed: %s\n",pcVar8,uVar6);
          iVar2 = 4;
        }
        else {
          iVar2 = 0;
          printf("Found %s in %s at %p\n",pcVar8,pcVar7,pcVar5);
          if (iVar3 == 0) {
            puts("Calling function...");
            fflush(_stdout);
            (*pcVar5)("     HELLO, WORLD!\n");
            puts("...apparently, we survived.  :)");
            puts("Unloading library...");
            fflush(_stdout);
          }
        }
        SDL_UnloadObject(lVar4);
      }
      SDL_Quit();
    }
  }
  else {
    pcVar7 = *argv;
    fprintf(_stderr,"USAGE: %s <library> <functionname>\n",pcVar7);
    fprintf(_stderr,"       %s --hello <lib with puts()>\n",pcVar7);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char *argv[])
{
	int retval = 0;
	int hello = 0;
	const char *libname = NULL;
	const char *symname = NULL;
	void *lib = NULL;
	fntype fn = NULL;

	if (argc != 3) {
		const char *app = argv[0];
		fprintf(stderr, "USAGE: %s <library> <functionname>\n", app);
		fprintf(stderr, "       %s --hello <lib with puts()>\n", app);
		return 1;
	}

	/* Initialize SDL */
	if ( SDL_Init(0) < 0 ) {
		fprintf(stderr, "Couldn't initialize SDL: %s\n",SDL_GetError());
		return 2;
	}

	if (strcmp(argv[1], "--hello") == 0) {
		hello = 1;
		libname = argv[2];
		symname = "puts";
	} else {
		libname = argv[1];
		symname = argv[2];
	}

	lib = SDL_LoadObject(libname);
        if (lib == NULL) {
		fprintf(stderr, "SDL_LoadObject('%s') failed: %s\n",
		        libname, SDL_GetError());
		retval = 3;
	} else {
		fn = (fntype) SDL_LoadFunction(lib, symname);
		if (fn == NULL) {
			fprintf(stderr, "SDL_LoadFunction('%s') failed: %s\n",
			        symname, SDL_GetError());
			retval = 4;
		} else {
			printf("Found %s in %s at %p\n", symname, libname, fn);
			if (hello) {
				printf("Calling function...\n");
				fflush(stdout);
				fn("     HELLO, WORLD!\n");
				printf("...apparently, we survived.  :)\n");
				printf("Unloading library...\n");
				fflush(stdout);
			}
		}
		SDL_UnloadObject(lib);
	}
	SDL_Quit();
	return retval;
}